

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_SubDMeshFragment::ControlNetQuadBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ON_3dVector N;
  ON_3dPoint P [4];
  
  bVar6 = GetControlNetQuad(this,false,P,&N);
  dVar5 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar4 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar3 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar2 = ON_BoundingBox::NanBoundingBox.m_min.y;
  dVar1 = ON_BoundingBox::NanBoundingBox.m_min.x;
  if (bVar6) {
    ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
    ON_BoundingBox::Set(__return_storage_ptr__,3,false,4,3,&P[0].x,0);
  }
  else {
    (__return_storage_ptr__->m_max).y = ON_BoundingBox::NanBoundingBox.m_max.y;
    (__return_storage_ptr__->m_max).z = dVar5;
    (__return_storage_ptr__->m_min).z = dVar3;
    (__return_storage_ptr__->m_max).x = dVar4;
    (__return_storage_ptr__->m_min).x = dVar1;
    (__return_storage_ptr__->m_min).y = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragment::ControlNetQuadBoundingBox() const
{
  ON_3dPoint P[4];
  ON_3dVector N;
  if (this->GetControlNetQuad(false, P, N))
  {
    ON_BoundingBox bbox;
    bbox.Set(3, 0, 4, 3, &P[0].x, false);
    return bbox;
  }
  return ON_BoundingBox::NanBoundingBox;
}